

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

bool __thiscall clipp::parser::check_conflicts(parser *this,dfs_traverser *match)

{
  bool bVar1;
  context_list *pcVar2;
  pointer paVar3;
  reference pcVar4;
  context *c;
  const_iterator __end6;
  const_iterator __begin6;
  context_list *__range6;
  reverse_iterator i;
  context *m;
  const_iterator __end2;
  const_iterator __begin2;
  context_list *__range2;
  bool conflict;
  dfs_traverser *match_local;
  parser *this_local;
  
  bVar1 = detail::scoped_dfs_traverser::start_of_repeat_group(&this->pos_);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = false;
    pcVar2 = group::depth_first_traverser::stack(match);
    __end2 = std::
             vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ::begin(pcVar2);
    m = (context *)
        std::
        vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ::end(pcVar2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>
                                       *)&m), bVar1) {
      i.current._M_current =
           (__normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>
            )__gnu_cxx::
             __normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>
             ::operator*(&__end2);
      bVar1 = group::exclusive(*(group **)i.current._M_current);
      if (bVar1) {
        std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>::rbegin
                  ((vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
                    *)&stack0xffffffffffffffb0);
        while( true ) {
          std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>::rend
                    ((vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
                      *)&__range6);
          bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>_>
                                   *)&stack0xffffffffffffffb0,
                                  (reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>_>
                                   *)&__range6);
          if (!bVar1) break;
          paVar3 = std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>_>
                   ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>_>
                                 *)&stack0xffffffffffffffb0);
          bVar1 = arg_mapping::blocked(paVar3);
          if (!bVar1) {
            paVar3 = std::
                     reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>_>
                     ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>_>
                                   *)&stack0xffffffffffffffb0);
            pcVar2 = group::depth_first_traverser::stack(&paVar3->match_);
            __end6 = std::
                     vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                     ::begin(pcVar2);
            c = (context *)
                std::
                vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                ::end(pcVar2);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end6,(__normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>
                                               *)&c), bVar1) {
              pcVar4 = __gnu_cxx::
                       __normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>
                       ::operator*(&__end6);
              if ((pcVar4->parent == *(group **)i.current._M_current) &&
                 (bVar1 = __gnu_cxx::operator!=
                                    (&pcVar4->cur,
                                     (__normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
                                      *)((long)i.current._M_current + 8)), bVar1)) {
                this_local._7_1_ = true;
                paVar3 = std::
                         reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>_>
                         ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>_>
                                       *)&stack0xffffffffffffffb0);
                paVar3->conflict_ = true;
              }
              __gnu_cxx::
              __normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>
              ::operator++(&__end6);
            }
          }
          paVar3 = std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>_>
                   ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>_>
                                 *)&stack0xffffffffffffffb0);
          if ((paVar3->startsRepeatGroup_ & 1U) != 0) break;
          std::
          reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>_>
          ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>_>
                        *)&stack0xffffffffffffffb0);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>
      ::operator++(&__end2);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool check_conflicts(const dfs_traverser& match)
    {
        if(pos_.start_of_repeat_group()) return false;
        bool conflict = false;
        for(const auto& m : match.stack()) {
            if(m.parent->exclusive()) {
                for(auto i = args_.rbegin(); i != args_.rend(); ++i) {
                    if(!i->blocked()) {
                        for(const auto& c : i->match_.stack()) {
                            //sibling within same exclusive group => conflict
                            if(c.parent == m.parent && c.cur != m.cur) {
                                conflict = true;
                                i->conflict_ = true;
                            }
                        }
                    }
                    //check for conflicts only within current repeat cycle
                    if(i->startsRepeatGroup_) break;
                }
            }
        }
        return conflict;
    }